

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::~Parser(Parser *this)

{
  code *pcVar1;
  Parser *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Parser::~Parser() {
	_input_file.close();
	delete _document;
}